

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O1

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::build(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
        *this)

{
  Value *pVVar1;
  Notifier *pNVar2;
  Container *pCVar3;
  Value *pVVar4;
  int iVar5;
  
  pNVar2 = (this->super_ObserverBase)._notifier;
  allocate_memory(this);
  pCVar3 = pNVar2->container;
  iVar5 = (int)((ulong)((long)(pCVar3->super_SmartDigraphBase)._arcs.
                              super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar3->super_SmartDigraphBase)._arcs.
                             super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (iVar5 != 0) {
    pVVar4 = this->values;
    do {
      iVar5 = iVar5 + -1;
      pVVar1 = pVVar4 + iVar5;
      (pVVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pVVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pVVar4[iVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

virtual void build() {
    Notifier* nf = Parent::notifier();
    allocate_memory();
    Item it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }